

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

char * __thiscall
adios2::format::BP5Deserializer::BreakdownVarName
          (BP5Deserializer *this,char *Name,DataType *type_p,int *element_size_p)

{
  char *in_RAX;
  long lVar1;
  char *pcVar2;
  char *local_28;
  
  local_28 = in_RAX;
  lVar1 = strtol(Name + 4,&local_28,10);
  *element_size_p = (int)lVar1;
  local_28 = local_28 + 1;
  lVar1 = strtol(local_28,&local_28,10);
  *type_p = (DataType)lVar1;
  pcVar2 = local_28 + 1;
  if ((DataType)lVar1 == Struct) {
    pcVar2 = strchr(pcVar2,0x5f);
    pcVar2 = pcVar2 + 1;
  }
  return pcVar2;
}

Assistant:

const char *BP5Deserializer::BreakdownVarName(const char *Name, DataType *type_p,
                                              int *element_size_p)
{
    // const char *NameStart = strchr(strchr(Name + 4, '_') + 1, '_') + 1;
    // sscanf(Name + 4, "%d_%d", &ElementSize, &Type);
    /* string formatted as bp5_%d_%d_actualname */
    char *p;
    // + 3 to skip BP5_ or bp5_ prefix
    long n = strtol(Name + 4, &p, 10);
    *element_size_p = static_cast<int>(n);
    ++p; // skip '_'
    long Type = strtol(p, &p, 10);
    *type_p = (DataType)Type;
    ++p; // skip '_'
    if (*type_p == DataType::Struct)
    {
        p = strchr(p, '_');
        ++p;
    }
    return p;
}